

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_expand_data.cc
# Opt level: O1

TemplateAnnotator * __thiscall ctemplate::PerExpandData::annotator(PerExpandData *this)

{
  int iVar1;
  TextTemplateAnnotator *pTVar2;
  
  pTVar2 = (TextTemplateAnnotator *)this->annotator_;
  if (((TemplateAnnotator *)pTVar2 == (TemplateAnnotator *)0x0) &&
     (pTVar2 = &annotator::g_default_annotator, annotator()::g_default_annotator == '\0')) {
    iVar1 = __cxa_guard_acquire(&annotator()::g_default_annotator);
    if (iVar1 != 0) {
      annotator::g_default_annotator.super_TemplateAnnotator._vptr_TemplateAnnotator =
           (TemplateAnnotator)&PTR__TemplateAnnotator_0014d428;
      __cxa_guard_release(&annotator()::g_default_annotator);
    }
  }
  return &pTVar2->super_TemplateAnnotator;
}

Assistant:

TemplateAnnotator* PerExpandData::annotator() const {
  if (annotator_ != NULL) {
    return annotator_;
  }
  // TextTemplateAnnotator has no static state.  So direct static definition
  // should be safe.
  static TextTemplateAnnotator g_default_annotator;
  return &g_default_annotator;
}